

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os-inl.h
# Opt level: O0

bool spdlog::details::os::is_color_terminal(void)

{
  int iVar1;
  anon_class_1_0_00000001 *in_stack_00000018;
  
  if (is_color_terminal()::result == '\0') {
    iVar1 = __cxa_guard_acquire(&is_color_terminal()::result);
    if (iVar1 != 0) {
      is_color_terminal::result =
           is_color_terminal::anon_class_1_0_00000001::operator()(in_stack_00000018);
      __cxa_guard_release(&is_color_terminal()::result);
    }
  }
  return (bool)(is_color_terminal::result & 1);
}

Assistant:

SPDLOG_INLINE bool is_color_terminal() SPDLOG_NOEXCEPT
{
#ifdef _WIN32
    return true;
#else

    static const bool result = []() {
        const char *env_colorterm_p = std::getenv("COLORTERM");
        if (env_colorterm_p != nullptr)
        {
            return true;
        }

        static constexpr std::array<const char *, 16> terms = {{"ansi", "color", "console", "cygwin", "gnome", "konsole", "kterm", "linux",
            "msys", "putty", "rxvt", "screen", "vt100", "xterm", "alacritty", "vt102"}};

        const char *env_term_p = std::getenv("TERM");
        if (env_term_p == nullptr)
        {
            return false;
        }

        return std::any_of(terms.begin(), terms.end(), [&](const char *term) { return std::strstr(env_term_p, term) != nullptr; });
    }();

    return result;
#endif
}